

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O0

void __thiscall Fifteen::setColor(Fifteen *this)

{
  bool bVar1;
  pointer this_00;
  vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
  *this_01;
  pointer pQVar2;
  QString local_50;
  reference local_38;
  unique_ptr<QPushButton,_std::default_delete<QPushButton>_> *tile;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
  *__range1;
  QString *tileColor;
  Fifteen *this_local;
  
  Options::getTileColor();
  this_00 = std::unique_ptr<TilesBoard,_std::default_delete<TilesBoard>_>::operator->
                      (&this->tilesBoard);
  this_01 = TilesBoard::getTiles(this_00);
  __end1 = std::
           vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           ::begin(this_01);
  tile = (unique_ptr<QPushButton,_std::default_delete<QPushButton>_> *)
         std::
         vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
         ::end(this_01);
  while (bVar1 = __gnu_cxx::
                 operator==<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_*,_std::vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>_>
                           (&__end1,(__normal_iterator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_*,_std::vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>_>
                                     *)&tile), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_38 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_*,_std::vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>_>
               ::operator*(&__end1);
    std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>::operator->(local_38);
    QAbstractButton::text();
    bVar1 = operator!=(&local_50,(nullptr_t)0x0);
    QString::~QString(&local_50);
    if (bVar1) {
      pQVar2 = std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>::operator->(local_38)
      ;
      QWidget::setStyleSheet((QString *)pQVar2);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_*,_std::vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void Fifteen::setColor()
{
    auto& tileColor = Options::getTileColor();

    for ( auto& tile : tilesBoard->getTiles() )
    {
        if ( tile->text() != nullptr )
        {
            tile->setStyleSheet( tileColor );
        }
    }    
}